

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsqlquerymodel_p.h
# Opt level: O2

QString * QSqlQueryModelSql::et(QString *__return_storage_ptr__,QString *a,QString *b)

{
  long lVar1;
  long in_FS_OFFSET;
  QLatin1StringView latin1;
  QArrayDataPointer<char16_t> local_60;
  QArrayDataPointer<char16_t> local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if ((a->d).size == 0) {
    lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  }
  else {
    if ((b->d).size != 0) {
      latin1 = et();
      QString::QString((QString *)&local_60,latin1);
      concat((QString *)&local_48,a,(QString *)&local_60);
      concat(__return_storage_ptr__,(QString *)&local_48,b);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_60);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
        return __return_storage_ptr__;
      }
      goto LAB_00130c20;
    }
    lVar1 = *(long *)(in_FS_OFFSET + 0x28);
    b = a;
  }
  if (lVar1 == local_30) {
    QArrayDataPointer<char16_t>::QArrayDataPointer(&__return_storage_ptr__->d,&b->d);
    return __return_storage_ptr__;
  }
LAB_00130c20:
  __stack_chk_fail();
}

Assistant:

inline const static QString et(const QString &a, const QString &b) { return a.isEmpty() ? b : b.isEmpty() ? a : concat(concat(a, et()), b); }